

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_min,void *p_max,
                        char *format,ImGuiSliderFlags flags)

{
  bool bVar1;
  int iVar2;
  ImGuiWindowTempData *min;
  ImGuiDataTypeInfo *pIVar3;
  char *in_RCX;
  void *in_RDX;
  ImGuiDataType in_ESI;
  ImRect *in_RDI;
  void *in_R8;
  char *in_R9;
  uint in_stack_00000008;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImRect grab_bb;
  ImU32 frame_col;
  bool is_clamp_input;
  bool make_active;
  bool clicked;
  bool input_requested_by_tabbing;
  bool temp_input_is_active;
  bool hovered;
  bool temp_input_allowed;
  ImRect total_bb;
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffde8;
  char *p_data_00;
  ImRect *in_stack_fffffffffffffdf0;
  undefined8 uVar4;
  undefined8 in_stack_fffffffffffffdf8;
  ImVec2 *pIVar5;
  float in_stack_fffffffffffffe00;
  ImGuiKey in_stack_fffffffffffffe04;
  ImGuiWindow *in_stack_fffffffffffffe08;
  ImGuiWindow *in_stack_fffffffffffffe10;
  ImGuiWindow *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  ImGuiID id_00;
  ImVec2 *text_size_if_known;
  void *in_stack_fffffffffffffe28;
  ImVec2 *text_end;
  ImDrawList *in_stack_fffffffffffffe30;
  ImVec2 *in_stack_fffffffffffffe38;
  ImVec2 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  float fVar6;
  ImRect *in_stack_fffffffffffffe50;
  ImVec2 in_stack_fffffffffffffe58;
  ImVec2 in_stack_fffffffffffffe60;
  ImGuiSliderFlags in_stack_fffffffffffffe68;
  ImRect *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe94;
  undefined1 in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 uVar7;
  float local_15c;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 *local_120;
  ImVec2 local_118 [8];
  byte local_d1;
  ImVec2 local_d0;
  float local_c8 [7];
  ImU32 local_ac;
  undefined1 local_a7;
  byte local_a6;
  byte local_a5;
  byte local_a4;
  byte local_a3;
  byte local_a2;
  byte local_a1;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImRect local_90;
  ImVec2 local_80;
  ImVec2 local_78;
  ImRect local_70;
  ImVec2 local_60;
  float local_58;
  ImGuiID local_54;
  ImGuiStyle *local_50;
  ImGuiContext *local_48;
  ImGuiWindow *local_40;
  char *local_38;
  void *local_30;
  char *local_28;
  void *local_20;
  ImGuiDataType local_14;
  ImRect *local_10;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_40 = GetCurrentWindow();
  if ((local_40->SkipItems & 1U) == 0) {
    local_48 = GImGui;
    local_50 = &GImGui->Style;
    local_54 = ImGuiWindow::GetID(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
                                  (char *)CONCAT44(in_stack_fffffffffffffe04,
                                                   in_stack_fffffffffffffe00));
    local_58 = CalcItemWidth();
    local_60 = CalcTextSize((char *)in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,
                            SUB81((ulong)in_stack_fffffffffffffe08 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe08,0));
    min = &local_40->DC;
    fVar6 = (local_50->FramePadding).y;
    ImVec2::ImVec2(&local_80,local_58,fVar6 + fVar6 + local_60.y);
    local_78 = ::operator+(in_stack_fffffffffffffde8,(ImVec2 *)0x4f6f08);
    ImRect::ImRect(&local_70,&min->CursorPos,&local_78);
    if (local_60.x <= 0.0) {
      local_15c = 0.0;
    }
    else {
      local_15c = (local_50->ItemInnerSpacing).x + local_60.x;
    }
    ImVec2::ImVec2(&local_a0,local_15c,0.0);
    local_98 = ::operator+(in_stack_fffffffffffffde8,(ImVec2 *)0x4f6fc8);
    fVar6 = (float)((ulong)in_stack_fffffffffffffde8 >> 0x20);
    ImRect::ImRect(&local_90,&local_70.Min,&local_98);
    local_a1 = (in_stack_00000008 & 0x80) == 0;
    ItemSize(in_stack_fffffffffffffdf0,fVar6);
    bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffe18,
                    (ImGuiID)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                    (ImRect *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
    if (bVar1) {
      if (local_38 == (char *)0x0) {
        pIVar3 = DataTypeGetInfo(local_14);
        local_38 = pIVar3->PrintFmt;
      }
      local_a2 = ItemHoverable((ImRect *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
      uVar7 = false;
      if ((local_a1 & 1) != 0) {
        uVar7 = TempInputIsActive(local_54);
      }
      local_a3 = uVar7;
      if ((bool)uVar7 == false) {
        in_stack_fffffffffffffe96 = false;
        if ((local_a1 & 1) != 0) {
          in_stack_fffffffffffffe96 = ((local_48->LastItemData).StatusFlags & 0x100U) != 0;
        }
        in_stack_fffffffffffffe95 = false;
        local_a4 = in_stack_fffffffffffffe96;
        if ((local_a2 & 1) != 0) {
          in_stack_fffffffffffffe95 =
               IsMouseClicked((ImGuiMouseButton)in_stack_fffffffffffffe00,
                              (ImGuiID)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                              (ImGuiInputFlags)in_stack_fffffffffffffdf8);
        }
        in_stack_fffffffffffffe94 = true;
        if ((((local_a4 & 1) == 0) &&
            (in_stack_fffffffffffffe94 = true, (bool)in_stack_fffffffffffffe95 == false)) &&
           (in_stack_fffffffffffffe94 = true, local_48->NavActivateId != local_54)) {
          in_stack_fffffffffffffe94 = local_48->NavActivateInputId == local_54;
        }
        local_a6 = in_stack_fffffffffffffe94;
        local_a5 = in_stack_fffffffffffffe95;
        if (((bool)in_stack_fffffffffffffe94 != false) && ((bool)in_stack_fffffffffffffe95 != false)
           ) {
          SetKeyOwner(in_stack_fffffffffffffe04,(ImGuiID)in_stack_fffffffffffffe00,
                      (ImGuiInputFlags)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
        }
        if ((((local_a6 & 1) != 0) && ((local_a1 & 1) != 0)) &&
           (((local_a4 & 1) != 0 ||
            ((((local_a5 & 1) != 0 && (((local_48->IO).KeyCtrl & 1U) != 0)) ||
             (local_48->NavActivateInputId == local_54)))))) {
          local_a3 = 1;
        }
        if (((local_a6 & 1) != 0) && ((local_a3 & 1) == 0)) {
          SetActiveID(id_00,in_stack_fffffffffffffe18);
          SetFocusID((ImGuiID)((ulong)in_stack_fffffffffffffe10 >> 0x20),in_stack_fffffffffffffe08);
          FocusWindow(in_stack_fffffffffffffe10);
          local_48->ActiveIdUsingNavDirMask = local_48->ActiveIdUsingNavDirMask | 3;
        }
      }
      if ((local_a3 & 1) == 0) {
        if (local_48->ActiveId == local_54) {
          fVar6 = 1.26117e-44;
        }
        else {
          fVar6 = 9.80909e-45;
          if ((local_a2 & 1) != 0) {
            fVar6 = 1.12104e-44;
          }
        }
        local_ac = GetColorU32(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
        RenderNavHighlight((ImRect *)
                           CONCAT17(uVar7,CONCAT16(in_stack_fffffffffffffe96,
                                                   CONCAT15(in_stack_fffffffffffffe95,
                                                            CONCAT14(in_stack_fffffffffffffe94,
                                                                     in_stack_fffffffffffffe90)))),
                           (ImGuiID)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                           (ImGuiNavHighlightFlags)in_stack_fffffffffffffe88);
        RenderFrame(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                    (ImU32)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffffe50 >> 0x18,0),fVar6);
        ImRect::ImRect(in_stack_fffffffffffffdf0);
        pIVar5 = &local_d0;
        uVar4 = CONCAT44((int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),in_stack_00000008);
        p_data_00 = local_38;
        local_d1 = SliderBehavior((ImRect *)CONCAT44(fVar6,in_stack_fffffffffffffe48),
                                  (ImGuiID)in_stack_fffffffffffffe40.y,
                                  (ImGuiDataType)in_stack_fffffffffffffe40.x,
                                  in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                  in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe60,
                                  in_stack_fffffffffffffe68,in_stack_fffffffffffffe70);
        if ((bool)local_d1) {
          MarkItemEdited(local_54);
        }
        if (local_d0.x < local_c8[0]) {
          in_stack_fffffffffffffe30 = local_40->DrawList;
          in_stack_fffffffffffffe38 = &local_d0;
          in_stack_fffffffffffffe40 = (ImVec2)local_c8;
          GetColorU32(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
          ImDrawList::AddRectFilled
                    ((ImDrawList *)in_stack_fffffffffffffe10,(ImVec2 *)in_stack_fffffffffffffe08,
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (ImU32)((ulong)pIVar5 >> 0x20),SUB84(pIVar5,0),
                     (ImDrawFlags)((ulong)uVar4 >> 0x20));
        }
        text_end = local_118;
        iVar2 = DataTypeFormatString
                          ((char *)pIVar5,(int)((ulong)uVar4 >> 0x20),(ImGuiDataType)uVar4,p_data_00
                           ,(char *)0x4f75f1);
        local_120 = (ImVec2 *)((long)&text_end->x + (long)iVar2);
        if ((local_48->LogEnabled & 1U) != 0) {
          LogSetNextTextDecoration("{","}");
        }
        pIVar5 = local_118;
        text_size_if_known = local_120;
        ImVec2::ImVec2(&local_128,0.5,0.5);
        RenderTextClipped((ImVec2 *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                          (char *)in_stack_fffffffffffffe30,(char *)text_end,text_size_if_known,
                          pIVar5,in_stack_fffffffffffffe50);
        uVar7 = (undefined1)((ulong)text_end >> 0x38);
        if (0.0 < local_60.x) {
          ImVec2::ImVec2(&local_130,local_70.Max.x + (local_50->ItemInnerSpacing).x,
                         local_70.Min.y + (local_50->FramePadding).y);
          RenderText(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                     (char *)in_stack_fffffffffffffe30,(bool)uVar7);
        }
        local_1 = (bool)(local_d1 & 1);
      }
      else {
        local_a7 = (in_stack_00000008 & 0x10) != 0;
        if (!(bool)local_a7) {
          local_28 = (char *)0x0;
          local_30 = (void *)0x0;
        }
        local_1 = TempInputScalar(local_10,local_54,local_28,
                                  (ImGuiDataType)((ulong)local_28 >> 0x20),local_30,
                                  (char *)CONCAT44(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48),local_20,local_38);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SliderScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    const bool temp_input_allowed = (flags & ImGuiSliderFlags_NoInput) == 0;
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb, temp_input_allowed ? ImGuiItemFlags_Inputable : 0))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;

    const bool hovered = ItemHoverable(frame_bb, id);
    bool temp_input_is_active = temp_input_allowed && TempInputIsActive(id);
    if (!temp_input_is_active)
    {
        // Tabbing or CTRL-clicking on Slider turns it into an input box
        const bool input_requested_by_tabbing = temp_input_allowed && (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_FocusedByTabbing) != 0;
        const bool clicked = hovered && IsMouseClicked(0, id);
        const bool make_active = (input_requested_by_tabbing || clicked || g.NavActivateId == id || g.NavActivateInputId == id);
        if (make_active && clicked)
            SetKeyOwner(ImGuiKey_MouseLeft, id);
        if (make_active && temp_input_allowed)
            if (input_requested_by_tabbing || (clicked && g.IO.KeyCtrl) || g.NavActivateInputId == id)
                temp_input_is_active = true;

        if (make_active && !temp_input_is_active)
        {
            SetActiveID(id, window);
            SetFocusID(id, window);
            FocusWindow(window);
            g.ActiveIdUsingNavDirMask |= (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right);
        }
    }

    if (temp_input_is_active)
    {
        // Only clamp CTRL+Click input when ImGuiSliderFlags_AlwaysClamp is set
        const bool is_clamp_input = (flags & ImGuiSliderFlags_AlwaysClamp) != 0;
        return TempInputScalar(frame_bb, id, label, data_type, p_data, format, is_clamp_input ? p_min : NULL, is_clamp_input ? p_max : NULL);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, g.Style.FrameRounding);

    // Slider behavior
    ImRect grab_bb;
    const bool value_changed = SliderBehavior(frame_bb, id, data_type, p_data, p_min, p_max, format, flags, &grab_bb);
    if (value_changed)
        MarkItemEdited(id);

    // Render grab
    if (grab_bb.Max.x > grab_bb.Min.x)
        window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    if (g.LogEnabled)
        LogSetNextTextDecoration("{", "}");
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    return value_changed;
}